

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_clock.cpp
# Opt level: O0

void __thiscall
sc_core::sc_clock::sc_clock
          (sc_clock *this,char *name_,double period_v_,sc_time_unit period_tu_,double duty_cycle_)

{
  sc_simcontext *this_00;
  undefined4 in_EDX;
  sc_clock *in_RDI;
  undefined8 in_XMM0_Qa;
  sc_time_unit tu;
  sc_simcontext *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  void **in_stack_ffffffffffffffa8;
  sc_signal<bool,_(sc_core::sc_writer_policy)0> *in_stack_ffffffffffffffb0;
  sc_event *in_stack_ffffffffffffffc0;
  
  tu = (sc_time_unit)((ulong)in_XMM0_Qa >> 0x20);
  sc_interface::sc_interface((sc_interface *)in_RDI);
  sc_signal<bool,_(sc_core::sc_writer_policy)0>::sc_signal
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  (in_RDI->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_in_if<bool> = (sc_signal_in_if<bool>)&PTR_register_port_0035cde8;
  (in_RDI->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_in_if<bool> = (sc_signal_in_if<bool>)&PTR_register_port_0035cde8;
  (in_RDI->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_inout_if<bool>.
  super_sc_signal_write_if<bool> = (sc_signal_write_if<bool>)&DAT_0035cec8;
  (in_RDI->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
  super_sc_prim_channel.super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_0035cf08;
  sc_time::sc_time(&in_RDI->m_period);
  in_RDI->m_duty_cycle = 0.0;
  sc_time::sc_time(&in_RDI->m_start_time);
  in_RDI->m_posedge_first = false;
  sc_time::sc_time(&in_RDI->m_posedge_time);
  sc_time::sc_time(&in_RDI->m_negedge_time);
  sc_event::sc_event(&in_RDI->m_next_posedge_event,"next_posedge_event");
  sc_event::sc_event(&in_RDI->m_next_negedge_event,"next_negedge_event");
  this_00 = sc_object::simcontext
                      ((sc_object *)
                       &(in_RDI->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
                        super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.
                        super_sc_signal_channel);
  sc_time::sc_time((sc_time *)this_00,(double)CONCAT44(in_EDX,in_stack_ffffffffffffff98),tu,
                   in_stack_ffffffffffffff88);
  init(in_RDI,(EVP_PKEY_CTX *)&stack0xffffffffffffffc0);
  sc_event::notify_internal(in_stack_ffffffffffffffc0,(sc_time *)in_RDI);
  return;
}

Assistant:

sc_clock::sc_clock( const char* name_,
		    double         period_v_,
		    sc_time_unit   period_tu_,
		    double         duty_cycle_ ) :
    base_type( name_ ),
    m_period(), m_duty_cycle(), m_start_time(), m_posedge_first(),
    m_posedge_time(), m_negedge_time(),
    m_next_posedge_event( sc_event::kernel_event, "next_posedge_event" ),
    m_next_negedge_event( sc_event::kernel_event, "next_negedge_event" )
{
    init( sc_time( period_v_, period_tu_, simcontext() ),
	  duty_cycle_,
	  SC_ZERO_TIME,
	  true );

    // posedge first
    m_next_posedge_event.notify_internal( m_start_time );
}